

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Texture::Texture(Texture *this)

{
  allocator local_25 [20];
  allocator local_11;
  Texture *local_10;
  Texture *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  this->mClipIdx = 0xffffffff;
  this->mStrength = 1.0;
  this->type = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->mUVChannelIndex,"unknown",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->mRealUVIndex = 0xffffffff;
  this->enabled = true;
  this->blendType = Additive;
  this->bCanUse = true;
  this->mapMode = UV;
  this->majorAxis = AXIS_X;
  this->wrapAmountH = 1.0;
  this->wrapAmountW = 1.0;
  this->wrapModeWidth = REPEAT;
  this->wrapModeHeight = REPEAT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->ordinal,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  return;
}

Assistant:

Texture()
        : mClipIdx(UINT_MAX)
        , mStrength         (1.0f)
        , type()
        , mUVChannelIndex   ("unknown")
        , mRealUVIndex      (UINT_MAX)
        , enabled           (true)
        , blendType         (Additive)
        , bCanUse           (true)
        , mapMode           (UV)
        , majorAxis         (AXIS_X)
        , wrapAmountH       (1.0f)
        , wrapAmountW       (1.0f)
        , wrapModeWidth     (REPEAT)
        , wrapModeHeight    (REPEAT)
        , ordinal           ("\x00")
    {}